

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> * __thiscall
embree::DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *this,
          DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar6;
  ulong uVar7;
  
  pDVar6 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)other->data;
  lVar5 = 0;
  uVar7 = 0;
  do {
    if (0x1f < uVar7) {
      DynamicStackArray<embree::vfloat_impl<4>,32ul,128ul>::operator=
                ((DynamicStackArray<embree::vfloat_impl<4>,32ul,128ul> *)&this->data);
    }
    uVar7 = uVar7 + 1;
    puVar2 = (undefined8 *)((long)&pDVar6->arr[0].field_0 + lVar5);
    uVar3 = puVar2[1];
    puVar1 = (undefined8 *)((long)&this->data->field_0 + lVar5);
    *puVar1 = *puVar2;
    puVar1[1] = uVar3;
    pDVar6 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)other->data;
    uVar4 = 0x80;
    if (pDVar6 == other) {
      uVar4 = 0x20;
    }
    lVar5 = lVar5 + 0x10;
  } while (uVar7 < uVar4);
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }